

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::operator%(BN *__return_storage_ptr__,BN *this,BN *bn)

{
  BN mod;
  BN div;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> _Stack_48;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_30;
  
  BN((BN *)&local_30);
  BN((BN *)&_Stack_48);
  divmod(this,bn,(BN *)&local_30,(BN *)&_Stack_48);
  BN(__return_storage_ptr__,(BN *)&_Stack_48);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&_Stack_48);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

const BN BN::operator % (const BN& bn)const
{
    BN div;
    BN mod;
    divmod(bn, div, mod);
    return move(mod);
}